

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_r * parse_protocols(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  size_t sVar1;
  _Bool _Var2;
  gtoken_t gVar3;
  gnode_r *__ptr;
  gnode_t *pgVar4;
  gnode_t **ppgVar5;
  size_t local_40;
  gnode_r *list;
  gnode_t *node;
  gtoken_t peek;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  node._4_4_ = gravity_lexer_peek(lexer_00);
  if (node._4_4_ != TOK_OP_GREATER) {
    __ptr = gnode_array_create();
    while (_Var2 = token_isidentifier(node._4_4_), _Var2) {
      pgVar4 = parse_id(parser);
      if (pgVar4 != (gnode_t *)0x0) {
        if (__ptr->n == __ptr->m) {
          if (__ptr->m == 0) {
            local_40 = 8;
          }
          else {
            local_40 = __ptr->m << 1;
          }
          __ptr->m = local_40;
          ppgVar5 = (gnode_t **)realloc(__ptr->p,__ptr->m << 3);
          __ptr->p = ppgVar5;
        }
        sVar1 = __ptr->n;
        __ptr->n = sVar1 + 1;
        __ptr->p[sVar1] = pgVar4;
      }
      gVar3 = gravity_lexer_peek(lexer_00);
      if (gVar3 != TOK_OP_COMMA) {
        return __ptr;
      }
      gravity_lexer_next(lexer_00);
      node._4_4_ = TOK_OP_COMMA;
    }
    if (__ptr != (gnode_r *)0x0) {
      if (__ptr->p != (gnode_t **)0x0) {
        free(__ptr->p);
      }
      free(__ptr);
    }
  }
  return (gnode_r *)0x0;
}

Assistant:

static gnode_r *parse_protocols (gravity_parser_t *parser) {
    DECLARE_LEXER;
    gtoken_t peek;
    gnode_t     *node = NULL;
    gnode_r     *list = NULL;

    // (id) (',' id)*

    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_GREATER) return NULL; // just an empty protocols implementation statement

    list = gnode_array_create();

loop:
    if (!token_isidentifier(peek)) goto abort;
    node = parse_id(parser);
    if (node) gnode_array_push(list, node);

    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA
        goto loop;
    }

    return list;

abort:
    if (list) gnode_array_free(list);
    return NULL;
}